

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

RGB __thiscall pbrt::SpectralFilm::GetPixelRGB(SpectralFilm *this,Point2i p,Float splatScale)

{
  Pixel *pPVar1;
  Float *pFVar2;
  Point2i in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar3;
  double dVar4;
  undefined8 uVar7;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar8 [56];
  RGB RVar9;
  int c;
  Float weightSum;
  Pixel *pixel;
  RGB rgb;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  SquareMatrix<3> *in_stack_ffffffffffffffa0;
  int local_40;
  RGB local_10;
  
  pPVar1 = Array2D<pbrt::SpectralFilm::Pixel>::operator[]
                     ((Array2D<pbrt::SpectralFilm::Pixel> *)(in_RDI + 0x70),in_RSI);
  RGB::RGB(&local_10,(float)pPVar1->rgbSum[0],(float)pPVar1->rgbSum[1],(float)pPVar1->rgbSum[2]);
  fVar3 = (float)pPVar1->rgbWeightSum;
  auVar6 = ZEXT464((uint)fVar3);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    auVar6 = ZEXT464((uint)fVar3);
    RGB::operator/=(&local_10,fVar3);
  }
  for (local_40 = 0; auVar8 = auVar6._8_56_, local_40 < 3; local_40 = local_40 + 1) {
    dVar4 = AtomicDouble::operator_cast_to_double((AtomicDouble *)0x8883b5);
    fVar3 = *(float *)(in_RDI + 0x6c);
    uVar7 = 0;
    pFVar2 = RGB::operator[](&local_10,local_40);
    auVar5._0_8_ = (double)*pFVar2;
    auVar5._8_8_ = uVar7;
    fVar3 = (float)(auVar5._0_8_ + ((double)in_XMM0_Da * dVar4) / (double)fVar3);
    auVar6 = ZEXT1664(CONCAT124(auVar5._4_12_,fVar3));
    *pFVar2 = fVar3;
  }
  RVar9 = pbrt::operator*(in_stack_ffffffffffffffa0,
                          (RGB *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  auVar6._0_8_ = RVar9._0_8_;
  auVar6._8_56_ = auVar8;
  uVar7 = vmovlpd_avx(auVar6._0_16_);
  RVar9.b = RVar9.b;
  RVar9.r = (Float)(int)uVar7;
  RVar9.g = (Float)(int)((ulong)uVar7 >> 0x20);
  return RVar9;
}

Assistant:

PBRT_CPU_GPU RGB SpectralFilm::GetPixelRGB(Point2i p, Float splatScale) const {
    // Note: this is effectively the same as RGBFilm::GetPixelRGB

    const Pixel &pixel = pixels[p];
    RGB rgb(pixel.rgbSum[0], pixel.rgbSum[1], pixel.rgbSum[2]);
    // Normalize _rgb_ with weight sum
    Float weightSum = pixel.rgbWeightSum;
    if (weightSum != 0)
        rgb /= weightSum;

    // Add splat value at pixel
    for (int c = 0; c < 3; ++c)
        rgb[c] += splatScale * pixel.rgbSplat[c] / filterIntegral;

    // Convert _rgb_ to output RGB color space
    rgb = outputRGBFromSensorRGB * rgb;

    return rgb;
}